

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QPolygonF * __thiscall
QGraphicsView::mapToScene(QPolygonF *__return_storage_ptr__,QGraphicsView *this,QPolygon *polygon)

{
  long lVar1;
  QPoint *point;
  QPoint *point_00;
  long in_FS_OFFSET;
  QPointF QVar2;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
  (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
  QList<QPointF>::reserve
            (&__return_storage_ptr__->super_QList<QPointF>,(polygon->super_QList<QPoint>).d.size);
  point_00 = (polygon->super_QList<QPoint>).d.ptr;
  for (lVar1 = (polygon->super_QList<QPoint>).d.size << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    QVar2 = mapToScene(this,point_00);
    local_40.yp = QVar2.yp;
    local_40.xp = QVar2.xp;
    QList<QPointF>::emplaceBack<QPointF>(&__return_storage_ptr__->super_QList<QPointF>,&local_40);
    point_00 = point_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsView::mapToScene(const QPolygon &polygon) const
{
    QPolygonF poly;
    poly.reserve(polygon.size());
    for (const QPoint &point : polygon)
        poly << mapToScene(point);
    return poly;
}